

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

Prog * __thiscall re2::RE2::ReverseProg(RE2 *this)

{
  int iVar1;
  undefined8 uVar2;
  long *in_FS_OFFSET;
  anon_class_8_1_ba1d2be6 __callable;
  RE2 *local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)&local_28;
  *in_FS_OFFSET = (long)&local_20;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  local_28 = this;
  iVar1 = pthread_once(&(this->rprog_once_)._M_once,__once_proxy);
  if (iVar1 == 0) {
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    return this->rprog_;
  }
  uVar2 = std::__throw_system_error(iVar1);
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  _Unwind_Resume(uVar2);
}

Assistant:

re2::Prog* RE2::ReverseProg() const {
  std::call_once(rprog_once_, [this]() {
    rprog_ = suffix_regexp_->CompileToReverseProg(options_.max_mem()/3);
    if (rprog_ == NULL) {
      if (options_.log_errors())
        LOG(ERROR) << "Error reverse compiling '" << trunc(pattern_) << "'";
      error_ = new string("pattern too large - reverse compile failed");
      error_code_ = RE2::ErrorPatternTooLarge;
    }
  });
  return rprog_;
}